

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRegistryTest.cpp
# Opt level: O3

void __thiscall
TEST_TestRegistry_groupFilterWorks_Test::~TEST_TestRegistry_groupFilterWorks_Test
          (TEST_TestRegistry_groupFilterWorks_Test *this)

{
  Utest::~Utest((Utest *)this);
  operator_delete(this,0x48);
  return;
}

Assistant:

TEST(TestRegistry, groupFilterWorks)
{
    test1->setGroupName("groupname");
    test2->setGroupName("noname");
    TestFilter groupFilter("groupname");
    myRegistry->setGroupFilters(&groupFilter);
    addAndRunAllTests();
    CHECK(test1->hasRun_);
    CHECK(!test2->hasRun_);
}